

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  router *this;
  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  uint uVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  invalid_argument *piVar4;
  allocator local_469;
  _Any_data local_468;
  _Manager_type local_458;
  _Invoker_type local_450;
  uint32_t local_448;
  dummy d;
  thread thd;
  uint32_t local_41c;
  bool stop;
  undefined7 uStack_417;
  undefined8 uStack_410;
  _Any_data local_408;
  code *local_3f8;
  code *local_3f0;
  rpc_server server;
  
  uVar1 = std::thread::hardware_concurrency();
  rest_rpc::rpc_service::rpc_server::rpc_server(&server,9000,(ulong)uVar1,0xe10,10);
  std::__cxx11::string::string((string *)local_468._M_pod_data,"add",(allocator *)&stop);
  thd._M_id._M_thread = (id)dummy::add;
  this = &server.router_;
  rest_rpc::rpc_service::router::
  register_handler<false,int(dummy::*)(std::weak_ptr<rest_rpc::rpc_service::connection>,int,int),dummy>
            (this,(string *)&local_468,(offset_in_dummy_to_subr *)&thd,&d);
  std::__cxx11::string::~string((string *)local_468._M_pod_data);
  std::__cxx11::string::string((string *)local_468._M_pod_data,"get_dummy",(allocator *)&thd);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,dummy1(std::weak_ptr<rest_rpc::rpc_service::connection>,dummy1)>
            (&server,(string *)&local_468,get_dummy);
  std::__cxx11::string::~string((string *)local_468._M_pod_data);
  std::__cxx11::string::string((string *)local_468._M_pod_data,"translate",(allocator *)&thd);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,std::__cxx11::string(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&)>
            (&server,(string *)&local_468,translate);
  std::__cxx11::string::~string((string *)local_468._M_pod_data);
  std::__cxx11::string::string((string *)local_468._M_pod_data,"hello",(allocator *)&thd);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,void(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&)>
            (&server,(string *)&local_468,hello);
  std::__cxx11::string::~string((string *)local_468._M_pod_data);
  std::__cxx11::string::string((string *)local_468._M_pod_data,"get_person_name",(allocator *)&thd);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,std::__cxx11::string(std::weak_ptr<rest_rpc::rpc_service::connection>,person_const&)>
            (&server,(string *)&local_468,get_person_name_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_468._M_pod_data);
  std::__cxx11::string::string((string *)local_468._M_pod_data,"get_person",(allocator *)&thd);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,person(std::weak_ptr<rest_rpc::rpc_service::connection>)>
            (&server,(string *)&local_468,get_person);
  std::__cxx11::string::~string((string *)local_468._M_pod_data);
  std::__cxx11::string::string((string *)local_468._M_pod_data,"upload",(allocator *)&thd);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,void(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&,std::__cxx11::string_const&)>
            (&server,(string *)&local_468,upload);
  std::__cxx11::string::~string((string *)local_468._M_pod_data);
  std::__cxx11::string::string((string *)local_468._M_pod_data,"download",(allocator *)&thd);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,std::__cxx11::string(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&)>
            (&server,(string *)&local_468,download);
  std::__cxx11::string::~string((string *)local_468._M_pod_data);
  std::__cxx11::string::string((string *)local_468._M_pod_data,"get_name",(allocator *)&thd);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,std::__cxx11::string(std::weak_ptr<rest_rpc::rpc_service::connection>,person_const&)>
            (&server,(string *)&local_468,get_name_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_468._M_pod_data);
  std::__cxx11::string::string((string *)local_468._M_pod_data,"delay_echo",(allocator *)&thd);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,void(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&)>
            (&server,(string *)&local_468,delay_echo);
  std::__cxx11::string::~string((string *)local_468._M_pod_data);
  std::__cxx11::string::string((string *)local_468._M_pod_data,"echo",(allocator *)&thd);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,std::__cxx11::string(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&)>
            (&server,(string *)&local_468,echo);
  std::__cxx11::string::~string((string *)local_468._M_pod_data);
  std::__cxx11::string::string((string *)local_468._M_pod_data,"get_int",(allocator *)&thd);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,int(std::weak_ptr<rest_rpc::rpc_service::connection>,int)>
            (&server,(string *)&local_468,get_int);
  std::__cxx11::string::~string((string *)local_468._M_pod_data);
  std::__cxx11::string::string((string *)&thd,"publish_by_token",&local_469);
  local_448 = rest_rpc::MD5::MD5Hash32((char *)thd._M_id._M_thread);
  this_00 = &server.router_.key2func_name_;
  iVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,&local_448);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"duplicate registration key !");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<unsigned_int&,std::__cxx11::string_const&>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)this_00,&local_448,&thd);
  local_41c = local_448;
  pmVar3 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_41c);
  uStack_410 = 0;
  local_468._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pmVar3->super__Function_base)._M_functor;
  local_468._8_8_ = *(undefined8 *)((long)&(pmVar3->super__Function_base)._M_functor + 8);
  *(rpc_server **)&(pmVar3->super__Function_base)._M_functor = &server;
  *(undefined8 *)((long)&(pmVar3->super__Function_base)._M_functor + 8) = 0;
  local_458 = (pmVar3->super__Function_base)._M_manager;
  (pmVar3->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]rest_rpc/include/rest_rpc/router.h:191:32)>
       ::_M_manager;
  local_450 = pmVar3->_M_invoker;
  pmVar3->_M_invoker =
       std::
       _Function_handler<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]rest_rpc/include/rest_rpc/router.h:191:32)>
       ::_M_invoke;
  _stop = &server;
  std::_Function_base::~_Function_base((_Function_base *)&local_468);
  std::__cxx11::string::~string((string *)&thd);
  std::__cxx11::string::string((string *)&thd,"publish",&local_469);
  local_448 = rest_rpc::MD5::MD5Hash32((char *)thd._M_id._M_thread);
  iVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,&local_448);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_int&,std::__cxx11::string_const&>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)this_00,&local_448,&thd);
    local_41c = local_448;
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,&local_41c);
    uStack_410 = 0;
    local_468._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(pmVar3->super__Function_base)._M_functor;
    local_468._8_8_ = *(undefined8 *)((long)&(pmVar3->super__Function_base)._M_functor + 8);
    *(rpc_server **)&(pmVar3->super__Function_base)._M_functor = &server;
    *(undefined8 *)((long)&(pmVar3->super__Function_base)._M_functor + 8) = 0;
    local_458 = (pmVar3->super__Function_base)._M_manager;
    (pmVar3->super__Function_base)._M_manager =
         std::
         _Function_handler<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]rest_rpc/include/rest_rpc/router.h:191:32)>
         ::_M_manager;
    local_450 = pmVar3->_M_invoker;
    pmVar3->_M_invoker =
         std::
         _Function_handler<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]rest_rpc/include/rest_rpc/router.h:191:32)>
         ::_M_invoke;
    _stop = &server;
    std::_Function_base::~_Function_base((_Function_base *)&local_468);
    std::__cxx11::string::~string((string *)&thd);
    local_408._M_unused._M_object = (void *)0x0;
    local_408._8_8_ = 0;
    local_3f0 = std::
                _Function_handler<void_(std::shared_ptr<rest_rpc::rpc_service::connection>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]rest_rpc/examples/server/main.cpp:155:7)>
                ::_M_invoke;
    local_3f8 = std::
                _Function_handler<void_(std::shared_ptr<rest_rpc::rpc_service::connection>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]rest_rpc/examples/server/main.cpp:155:7)>
                ::_M_manager;
    std::
    function<void_(std::shared_ptr<rest_rpc::rpc_service::connection>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::operator=(&server.on_net_err_callback_,
                (function<void_(std::shared_ptr<rest_rpc::rpc_service::connection>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                 *)&local_408);
    std::_Function_base::~_Function_base((_Function_base *)&local_408);
    _stop = (rpc_server *)((ulong)_stop & 0xffffffffffffff00);
    thd._M_id._M_thread = (id)0;
    local_468._M_unused._M_object = operator_new(0x18);
    *(undefined ***)local_468._M_unused._0_8_ = &PTR___State_0017dc58;
    *(rpc_server **)((long)local_468._M_unused._0_8_ + 8) = &server;
    *(allocator **)((long)local_468._M_unused._0_8_ + 0x10) = (allocator *)&stop;
    std::thread::_M_start_thread(&thd,&local_468,0);
    if ((long *)local_468._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_468._M_unused._M_object + 8))();
    }
    rest_rpc::rpc_service::io_service_pool::run(&server.io_service_pool_);
    _stop = (rpc_server *)CONCAT71(uStack_417,1);
    std::thread::join();
    std::thread::~thread(&thd);
    rest_rpc::rpc_service::rpc_server::~rpc_server(&server);
    return 0;
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"duplicate registration key !");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int main() {
  //  benchmark_test();
  rpc_server server(9000, std::thread::hardware_concurrency(), 3600);

  dummy d;
  server.register_handler("add", &dummy::add, &d);

  server.register_handler("get_dummy", get_dummy);

  server.register_handler("translate", translate);
  server.register_handler("hello", hello);
  server.register_handler("get_person_name", get_person_name);
  server.register_handler("get_person", get_person);
  server.register_handler("upload", upload);
  server.register_handler("download", download);
  server.register_handler("get_name", get_name);
  server.register_handler("delay_echo", delay_echo);
  server.register_handler("echo", echo);
  server.register_handler("get_int", get_int);

  server.register_handler("publish_by_token", [&server](rpc_conn conn,
                                                        std::string key,
                                                        std::string token,
                                                        std::string val) {
    server.publish_by_token(std::move(key), std::move(token), std::move(val));
  });

  server.register_handler("publish",
                          [&server](rpc_conn conn, std::string key,
                                    std::string token, std::string val) {
                            server.publish(std::move(key), std::move(val));
                          });
  server.set_network_err_callback(
      [](std::shared_ptr<connection> conn, std::string reason) {
        std::cout << "remote client address: " << conn->remote_address()
                  << " networking error, reason: " << reason << "\n";
      });

  bool stop = false;
  std::thread thd([&server, &stop] {
    person p{1, "tom", 20};
    while (!stop) {
      server.publish("key", "hello subscriber");
      auto list = server.get_token_list();
      for (auto &token : list) {
        server.publish_by_token("key", token, p);
        server.publish_by_token("key1", token, "hello subscriber1");
      }
      std::this_thread::sleep_for(std::chrono::milliseconds(50));
    }
  });

  server.run();
  stop = true;
  thd.join();
}